

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::ParseBlock(DXFImporter *this,LineReader *reader,FileData *output)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pBVar3;
  char *__s2;
  int iVar4;
  LineReader *reader_00;
  LineReader *pLVar5;
  Logger *this_00;
  Block local_98;
  
  paVar2 = &local_98.name.field_2;
  local_98.name._M_string_length = 0;
  local_98.name.field_2._8_8_ = 0;
  local_98.base.z = 0.0;
  local_98._92_4_ = 0;
  local_98.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.name.field_2._M_allocated_capacity = 0;
  local_98.base.x = 0.0;
  local_98.base.y = 0.0;
  local_98.name._M_dataplus._M_p = (pointer)paVar2;
  std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::
  emplace_back<Assimp::DXF::Block>(&output->blocks,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.name._M_dataplus._M_p,local_98.name.field_2._M_allocated_capacity + 1);
  }
  std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::~vector
            (&local_98.insertions);
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ::~vector(&local_98.lines);
  if (reader->end < 2) {
    pBVar3 = (output->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish;
    psVar1 = &reader->value;
    do {
      iVar4 = reader->groupcode;
      if (iVar4 < 10) {
        if (iVar4 == 0) {
          iVar4 = strcmp("ENDBLK",(psVar1->_M_dataplus)._M_p);
          if (iVar4 == 0) {
            return;
          }
          goto LAB_00413358;
        }
        if (iVar4 == 2) {
          std::__cxx11::string::_M_assign((string *)&pBVar3[-1].name);
          goto LAB_0041332d;
        }
LAB_00413333:
        DXF::LineReader::operator++(reader);
      }
      else {
        if (iVar4 == 10) {
          local_98.lines.
          super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_98.lines.
                                super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
          fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_98,true);
          pBVar3[-1].base.x =
               local_98.lines.
               super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ._M_impl.super__Vector_impl_data._M_start._0_4_;
        }
        else if (iVar4 == 0x14) {
          local_98.lines.
          super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_98.lines.
                                super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
          fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_98,true);
          pBVar3[-1].base.y =
               local_98.lines.
               super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ._M_impl.super__Vector_impl_data._M_start._0_4_;
        }
        else {
          if (iVar4 != 0x1e) goto LAB_00413333;
          local_98.lines.
          super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_98.lines.
                                super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          fast_atoreal_move<float>((psVar1->_M_dataplus)._M_p,(float *)&local_98,true);
          pBVar3[-1].base.z =
               local_98.lines.
               super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ._M_impl.super__Vector_impl_data._M_start._0_4_;
        }
LAB_0041332d:
        if (reader->groupcode != 0) goto LAB_00413333;
LAB_00413358:
        __s2 = (psVar1->_M_dataplus)._M_p;
        iVar4 = strcmp("POLYLINE",__s2);
        if (iVar4 == 0) {
          pLVar5 = DXF::LineReader::operator++(reader);
          ParsePolyLine(this,pLVar5,output);
        }
        else {
          iVar4 = strcmp("INSERT",__s2);
          if (iVar4 == 0) {
            this_00 = DefaultLogger::get();
            Logger::warn(this_00,"DXF: INSERT within a BLOCK not currently supported; skipping");
            iVar4 = reader->end;
            while( true ) {
              if (1 < iVar4) {
                return;
              }
              if ((reader->groupcode == 0) &&
                 (iVar4 = strcmp("ENDBLK",(psVar1->_M_dataplus)._M_p), iVar4 == 0)) break;
              DXF::LineReader::operator++(reader);
              iVar4 = reader->end;
            }
            return;
          }
          iVar4 = strcmp("3DFACE",__s2);
          if (((iVar4 != 0) && (iVar4 = strcmp("LINE",__s2), iVar4 != 0)) &&
             (iVar4 = strcmp("3DLINE",__s2), iVar4 != 0)) goto LAB_00413333;
          pLVar5 = reader;
          reader_00 = DXF::LineReader::operator++(reader);
          Parse3DFace((DXFImporter *)pLVar5,reader_00,output);
        }
      }
    } while (reader->end < 2);
  }
  return;
}

Assistant:

void DXFImporter::ParseBlock(DXF::LineReader& reader, DXF::FileData& output) {
    // push a new block onto the stack.
    output.blocks.push_back( DXF::Block() );
    DXF::Block& block = output.blocks.back();

    while( !reader.End() && !reader.Is(0,"ENDBLK")) {

        switch(reader.GroupCode()) {
            case GroupCode_Name:
                block.name = reader.Value();
                break;

            case GroupCode_XComp:
                block.base.x = reader.ValueAsFloat();
                break;
            case GroupCode_YComp:
                block.base.y = reader.ValueAsFloat();
                break;
            case GroupCode_ZComp:
                block.base.z = reader.ValueAsFloat();
                break;
        }

        if (reader.Is(0,"POLYLINE")) {
            ParsePolyLine(++reader,output);
            continue;
        }

        // XXX is this a valid case?
        if (reader.Is(0,"INSERT")) {
            ASSIMP_LOG_WARN("DXF: INSERT within a BLOCK not currently supported; skipping");
            for( ;!reader.End() && !reader.Is(0,"ENDBLK"); ++reader);
            break;
        }

        else if (reader.Is(0,"3DFACE") || reader.Is(0,"LINE") || reader.Is(0,"3DLINE")) {
            //http://sourceforge.net/tracker/index.php?func=detail&aid=2970566&group_id=226462&atid=1067632
            Parse3DFace(++reader, output);
            continue;
        }
        ++reader;
    }
}